

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O3

void __thiscall
nestl::has_exceptions::list<int,_nestl::allocator<int>_>::list
          (list<int,_nestl::allocator<int>_> *this,list<int,_nestl::allocator<int>_> *other)

{
  list_node_base *plVar1;
  undefined8 uVar2;
  default_operation_error err;
  void *local_28;
  void *local_20;
  exception_ptr local_18;
  
  plVar1 = &(this->super_list<int,_nestl::allocator<int>_>).m_node;
  (this->super_list<int,_nestl::allocator<int>_>).m_node.m_next = plVar1;
  (this->super_list<int,_nestl::allocator<int>_>).m_node.m_prev = plVar1;
  local_18._M_exception_object = (void *)0x0;
  impl::list<int,_nestl::allocator<int>_>::copy_nothrow<nestl::has_exceptions::exception_ptr_error>
            (&this->super_list<int,_nestl::allocator<int>_>,(exception_ptr_error *)&local_18,
             &other->super_list<int,_nestl::allocator<int>_>);
  if (local_18._M_exception_object == (void *)0x0) {
    return;
  }
  local_20 = local_18._M_exception_object;
  std::__exception_ptr::exception_ptr::_M_addref();
  local_28 = local_20;
  if (local_20 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_addref();
  }
  uVar2 = std::rethrow_exception((exception_ptr)&local_28);
  if (local_28 != (void *)0x0) {
    std::__exception_ptr::exception_ptr::_M_release();
  }
  has_exceptions::list();
  _Unwind_Resume(uVar2);
}

Assistant:

list(const list& other)
    {
        default_operation_error err;
        this->copy_nothrow(err, other);
        if (err)
        {
            throw_exception(err);
        }
    }